

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O1

void __thiscall
vkt::QueryPool::anon_unknown_0::GeometryShaderTestInstance::createPipeline
          (GeometryShaderTestInstance *this)

{
  pointer pcVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var2;
  VkPipelineLayout obj;
  VkPipeline obj_00;
  StencilOpState _front;
  StencilOpState _front_00;
  StencilOpState _back;
  StencilOpState _back_00;
  DeviceInterface *deviceInterface;
  VkDevice device;
  const_iterator cVar3;
  VkPhysicalDeviceFeatures *pVVar4;
  _Alloc_hider local_5a8;
  undefined1 auStack_5a0 [40];
  pointer local_578;
  pointer local_570;
  pointer local_568;
  pointer local_560;
  pointer local_550;
  Move<vk::Handle<(vk::HandleType)18>_> local_538;
  vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> local_518;
  vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> local_4f8;
  VkShaderModule local_4d8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_4d0;
  VkShaderModule local_4b8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_4b0;
  VkShaderModule local_498;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_490;
  VkPipelineVertexInputStateCreateInfo vf_info;
  VkStencilOpState local_448;
  VkStencilOpState local_428;
  VkStencilOpState local_408;
  VkStencilOpState local_3e8;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
  PipelineCreateInfo pipelineCreateInfo;
  Attachment attachmentState;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  
  deviceInterface =
       Context::getDeviceInterface
                 ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                  super_TestInstance.m_context);
  device = Context::getDevice((this->super_GraphicBasicTestInstance).
                              super_StatisticQueryTestInstance.super_TestInstance.m_context);
  p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
               super_TestInstance.m_context)->m_progCollection;
  pcVar1 = auStack_5a0 + 8;
  local_5a8._M_p = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"vertex","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var2,(key_type *)&local_5a8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo,deviceInterface,device,
             *(ProgramBinary **)(cVar3._M_node + 2),0);
  DStack_490.m_device = (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  DStack_490.m_allocator =
       (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  local_498.m_internal = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  DStack_490.m_deviceIface =
       (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)0x0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)0x0;
  if (local_5a8._M_p != pcVar1) {
    operator_delete(local_5a8._M_p,auStack_5a0._8_8_ + 1);
  }
  p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
               super_TestInstance.m_context)->m_progCollection;
  local_5a8._M_p = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"geometry","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var2,(key_type *)&local_5a8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo,deviceInterface,device,
             *(ProgramBinary **)(cVar3._M_node + 2),0);
  DStack_4b0.m_device = (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  DStack_4b0.m_allocator =
       (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  local_4b8.m_internal = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  DStack_4b0.m_deviceIface =
       (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)0x0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)0x0;
  if (local_5a8._M_p != pcVar1) {
    operator_delete(local_5a8._M_p,auStack_5a0._8_8_ + 1);
  }
  p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
               super_TestInstance.m_context)->m_progCollection;
  local_5a8._M_p = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"fragment","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var2,(key_type *)&local_5a8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo,deviceInterface,device,
             *(ProgramBinary **)(cVar3._M_node + 2),0);
  DStack_4d0.m_device = (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  DStack_4d0.m_allocator =
       (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  local_4d8.m_internal = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  DStack_4d0.m_deviceIface =
       (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)0x0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)0x0;
  if (local_5a8._M_p != pcVar1) {
    operator_delete(local_5a8._M_p,auStack_5a0._8_8_ + 1);
  }
  Draw::PipelineCreateInfo::ColorBlendState::Attachment::Attachment
            (&attachmentState,0,VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,
             VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,0xf);
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)0x0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount = 0;
  Draw::PipelineLayoutCreateInfo::PipelineLayoutCreateInfo
            (&pipelineLayoutCreateInfo,
             (vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
              *)&pipelineCreateInfo,0,(VkPushConstantRange *)0x0);
  if (pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_ != 0) {
    operator_delete((void *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_,
                    pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_ -
                    pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_);
  }
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&local_5a8,deviceInterface,device,
             &pipelineLayoutCreateInfo.super_VkPipelineLayoutCreateInfo,(VkAllocationCallbacks *)0x0
            );
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags = auStack_5a0._8_4_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount = auStack_5a0._12_4_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)auStack_5a0._16_8_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_ = local_5a8._M_p;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)auStack_5a0._0_8_;
  local_5a8._M_p = (pointer)0x0;
  auStack_5a0._0_8_ = (DeviceInterface *)0x0;
  auStack_5a0._8_8_ = 0;
  auStack_5a0._16_8_ = 0;
  obj.m_internal =
       (this->super_GraphicBasicTestInstance).m_pipelineLayout.
       super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&(this->super_GraphicBasicTestInstance).m_pipelineLayout.
                super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter,obj);
  }
  (this->super_GraphicBasicTestInstance).m_pipelineLayout.
  super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  (this->super_GraphicBasicTestInstance).m_pipelineLayout.
  super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  (this->super_GraphicBasicTestInstance).m_pipelineLayout.
  super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  (this->super_GraphicBasicTestInstance).m_pipelineLayout.
  super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  if (local_5a8._M_p != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)auStack_5a0,
               (VkPipelineLayout)local_5a8._M_p);
  }
  vf_info.pVertexBindingDescriptions = &vertexInputBindingDescription;
  vertexInputBindingDescription.binding = 0;
  vertexInputBindingDescription.stride = 0x20;
  vertexInputBindingDescription.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  vf_info.pVertexAttributeDescriptions = vertexInputAttributeDescriptions;
  vertexInputAttributeDescriptions[1].location = 1;
  vertexInputAttributeDescriptions[1].binding = 0;
  vertexInputAttributeDescriptions[1].format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexInputAttributeDescriptions[1].offset = 0x10;
  vertexInputAttributeDescriptions[0].location = 0;
  vertexInputAttributeDescriptions[0].binding = 0;
  vertexInputAttributeDescriptions[0].format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexInputAttributeDescriptions[0].offset = 0;
  vf_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  vf_info.pNext = (void *)0x0;
  vf_info.flags = 0;
  vf_info.vertexBindingDescriptionCount = 1;
  vf_info.vertexAttributeDescriptionCount = 2;
  Draw::PipelineCreateInfo::PipelineCreateInfo
            (&pipelineCreateInfo,
             (VkPipelineLayout)
             (this->super_GraphicBasicTestInstance).m_pipelineLayout.
             super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal,
             (VkRenderPass)
             (this->super_GraphicBasicTestInstance).m_renderPass.
             super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal,0,0);
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_5a8,local_498,"main",VK_SHADER_STAGE_VERTEX_BIT);
  Draw::PipelineCreateInfo::addShader
            (&pipelineCreateInfo,(VkPipelineShaderStageCreateInfo *)&local_5a8);
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_5a8,local_4b8,"main",VK_SHADER_STAGE_GEOMETRY_BIT);
  Draw::PipelineCreateInfo::addShader
            (&pipelineCreateInfo,(VkPipelineShaderStageCreateInfo *)&local_5a8);
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_5a8,local_4d8,"main",VK_SHADER_STAGE_FRAGMENT_BIT);
  Draw::PipelineCreateInfo::addShader
            (&pipelineCreateInfo,(VkPipelineShaderStageCreateInfo *)&local_5a8);
  Draw::PipelineCreateInfo::InputAssemblerState::InputAssemblerState
            ((InputAssemblerState *)&local_5a8,
             ((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology,0);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineInputAssemblyStateCreateInfo *)&local_5a8);
  Draw::PipelineCreateInfo::ColorBlendState::ColorBlendState
            ((ColorBlendState *)&local_5a8,1,
             &attachmentState.super_VkPipelineColorBlendAttachmentState,0,VK_LOGIC_OP_COPY);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineColorBlendStateCreateInfo *)&local_5a8);
  if (local_570 != (pointer)0x0) {
    operator_delete(local_570,(long)local_560 - (long)local_570);
  }
  local_518.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_518.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_518.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_518.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
  local_518.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_518.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  (local_518.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->x = 0.0;
  (local_518.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->y = 0.0;
  (local_518.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->width = 64.0;
  (local_518.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->height = 64.0;
  (local_518.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->minDepth = 0.0;
  (local_518.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
   super__Vector_impl_data._M_start)->maxDepth = 1.0;
  local_4f8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4f8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4f8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_518.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_518.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_4f8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
  local_4f8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_4f8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  ((local_4f8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
    super__Vector_impl_data._M_start)->offset).x = 0;
  ((local_4f8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
    super__Vector_impl_data._M_start)->offset).y = 0;
  ((local_4f8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
    super__Vector_impl_data._M_start)->extent).width = 0x40;
  ((local_4f8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
    super__Vector_impl_data._M_start)->extent).height = 0x40;
  local_4f8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_4f8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
       super__Vector_impl_data._M_finish;
  Draw::PipelineCreateInfo::ViewportState::ViewportState
            ((ViewportState *)&local_5a8,1,&local_518,&local_4f8);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineViewportStateCreateInfo *)&local_5a8);
  if (local_560 != (pointer)0x0) {
    operator_delete(local_560,(long)local_550 - (long)local_560);
  }
  if (local_578 != (pointer)0x0) {
    operator_delete(local_578,(long)local_568 - (long)local_578);
  }
  if (local_4f8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4f8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4f8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4f8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_518.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_518.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_518.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_518.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pVVar4 = Context::getDeviceFeatures
                     ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                      super_TestInstance.m_context);
  if (pVVar4->depthBounds == 0) {
    Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
              ((StencilOpState *)&local_428,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
               VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
    Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
              ((StencilOpState *)&local_448,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
               VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
    _front_00.super_VkStencilOpState.depthFailOp = local_428.depthFailOp;
    _front_00.super_VkStencilOpState.failOp = local_428.failOp;
    _front_00.super_VkStencilOpState.passOp = local_428.passOp;
    _front_00.super_VkStencilOpState.compareOp = local_428.compareOp;
    _front_00.super_VkStencilOpState.compareMask = local_428.compareMask;
    _front_00.super_VkStencilOpState.writeMask = local_428.writeMask;
    _front_00.super_VkStencilOpState.reference = local_428.reference;
    _back_00.super_VkStencilOpState.depthFailOp = local_448.depthFailOp;
    _back_00.super_VkStencilOpState.failOp = local_448.failOp;
    _back_00.super_VkStencilOpState.passOp = local_448.passOp;
    _back_00.super_VkStencilOpState.compareOp = local_448.compareOp;
    _back_00.super_VkStencilOpState.compareMask = local_448.compareMask;
    _back_00.super_VkStencilOpState.writeMask = local_448.writeMask;
    _back_00.super_VkStencilOpState.reference = local_448.reference;
    Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
              ((DepthStencilState *)&local_5a8,0,0,VK_COMPARE_OP_ALWAYS,0,0,_front_00,_back_00,0.0,
               1.0);
    Draw::PipelineCreateInfo::addState
              (&pipelineCreateInfo,(VkPipelineDepthStencilStateCreateInfo *)&local_5a8);
  }
  else {
    Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
              ((StencilOpState *)&local_3e8,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
               VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
    Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
              ((StencilOpState *)&local_408,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
               VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
    _front.super_VkStencilOpState.depthFailOp = local_3e8.depthFailOp;
    _front.super_VkStencilOpState.failOp = local_3e8.failOp;
    _front.super_VkStencilOpState.passOp = local_3e8.passOp;
    _front.super_VkStencilOpState.compareOp = local_3e8.compareOp;
    _front.super_VkStencilOpState.compareMask = local_3e8.compareMask;
    _front.super_VkStencilOpState.writeMask = local_3e8.writeMask;
    _front.super_VkStencilOpState.reference = local_3e8.reference;
    _back.super_VkStencilOpState.depthFailOp = local_408.depthFailOp;
    _back.super_VkStencilOpState.failOp = local_408.failOp;
    _back.super_VkStencilOpState.passOp = local_408.passOp;
    _back.super_VkStencilOpState.compareOp = local_408.compareOp;
    _back.super_VkStencilOpState.compareMask = local_408.compareMask;
    _back.super_VkStencilOpState.writeMask = local_408.writeMask;
    _back.super_VkStencilOpState.reference = local_408.reference;
    Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
              ((DepthStencilState *)&local_5a8,1,1,VK_COMPARE_OP_GREATER_OR_EQUAL,1,0,_front,_back,
               0.0,1.0);
    Draw::PipelineCreateInfo::addState
              (&pipelineCreateInfo,(VkPipelineDepthStencilStateCreateInfo *)&local_5a8);
  }
  Draw::PipelineCreateInfo::RasterizerState::RasterizerState
            ((RasterizerState *)&local_5a8,0,0,VK_POLYGON_MODE_FILL,0,VK_FRONT_FACE_CLOCKWISE,1,0.0,
             0.0,0.0,1.0);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineRasterizationStateCreateInfo *)&local_5a8);
  local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       (deUint64)operator_new(4);
  local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       (local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal + 4);
  *(char *)(local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal + 0) =
       -1;
  *(char *)(local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal + 1) =
       -1;
  *(char *)(local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal + 2) =
       -1;
  *(char *)(local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal + 3) =
       -1;
  local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       (VkDevice)
       local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  Draw::PipelineCreateInfo::MultiSampleState::MultiSampleState
            ((MultiSampleState *)&local_5a8,VK_SAMPLE_COUNT_1_BIT,0,0.0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_538,false,false);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineMultisampleStateCreateInfo *)&local_5a8);
  if (local_578 != (pointer)0x0) {
    operator_delete(local_578,(long)local_568 - (long)local_578);
  }
  if ((pointer)local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal !=
      (pointer)0x0) {
    operator_delete((void *)local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                            m_internal,
                    (long)local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                          m_device -
                    local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                    m_internal);
  }
  Draw::PipelineCreateInfo::addState(&pipelineCreateInfo,&vf_info);
  ::vk::createGraphicsPipeline
            (&local_538,deviceInterface,device,(VkPipelineCache)0x0,
             &pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo,(VkAllocationCallbacks *)0x0);
  auStack_5a0._8_8_ =
       local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  auStack_5a0._16_8_ =
       local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_5a8._M_p =
       (pointer)local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  auStack_5a0._0_8_ =
       local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_00.m_internal =
       (this->super_GraphicBasicTestInstance).m_pipeline.
       super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&(this->super_GraphicBasicTestInstance).m_pipeline.
                super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,obj_00);
  }
  (this->super_GraphicBasicTestInstance).m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.
  m_data.deleter.m_device = (VkDevice)auStack_5a0._8_8_;
  (this->super_GraphicBasicTestInstance).m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.
  m_data.deleter.m_allocator = (VkAllocationCallbacks *)auStack_5a0._16_8_;
  (this->super_GraphicBasicTestInstance).m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.
  m_data.object.m_internal = (deUint64)local_5a8._M_p;
  (this->super_GraphicBasicTestInstance).m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.
  m_data.deleter.m_deviceIface = (DeviceInterface *)auStack_5a0._0_8_;
  if (local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               (VkPipeline)
               local_538.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  if (pipelineCreateInfo.m_multisampleStateSampleMask.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_multisampleStateSampleMask.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_multisampleStateSampleMask.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_multisampleStateSampleMask.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_scissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_scissors.
                    super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_scissors.
                          super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_scissors.
                          super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_viewports.
      super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_viewports.
                    super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_viewports.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_viewports.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_dynamicStates.
      super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_dynamicStates.
                    super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_dynamicStates.
                          super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_dynamicStates.
                          super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_colorBlendStateAttachments.
      super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_colorBlendStateAttachments.
                    super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_colorBlendStateAttachments.
                          super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_colorBlendStateAttachments.
                          super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_shaders.
      super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_shaders.
                    super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_shaders.
                          super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_shaders.
                          super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineLayoutCreateInfo.m_pushConstantRanges.
      super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineLayoutCreateInfo.m_pushConstantRanges.
                    super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineLayoutCreateInfo.m_pushConstantRanges.
                          super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineLayoutCreateInfo.m_pushConstantRanges.
                          super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineLayoutCreateInfo.m_setLayouts.
      super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineLayoutCreateInfo.m_setLayouts.
                    super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineLayoutCreateInfo.m_setLayouts.
                          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineLayoutCreateInfo.m_setLayouts.
                          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4d8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_4d0,local_4d8);
  }
  if (local_4b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_4b0,local_4b8);
  }
  if (local_498.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_490,local_498);
  }
  return;
}

Assistant:

void GeometryShaderTestInstance::createPipeline (void)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	// Pipeline
	Unique<VkShaderModule> vs(createShaderModule(vk, device, m_context.getBinaryCollection().get("vertex"), (VkShaderModuleCreateFlags)0));
	Unique<VkShaderModule> gs(createShaderModule(vk, device, m_context.getBinaryCollection().get("geometry"), (VkShaderModuleCreateFlags)0));
	Unique<VkShaderModule> fs(createShaderModule(vk, device, m_context.getBinaryCollection().get("fragment"), (VkShaderModuleCreateFlags)0));

	const PipelineCreateInfo::ColorBlendState::Attachment attachmentState;

	const PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
	m_pipelineLayout = createPipelineLayout(vk, device, &pipelineLayoutCreateInfo);

	const VkVertexInputBindingDescription vertexInputBindingDescription		=
	{
		0u,											// binding;
		static_cast<deUint32>(sizeof(VertexData)),	// stride;
		VK_VERTEX_INPUT_RATE_VERTEX					// inputRate
	};

	const VkVertexInputAttributeDescription vertexInputAttributeDescriptions[] =
	{
		{
			0u,
			0u,
			VK_FORMAT_R32G32B32A32_SFLOAT,
			0u
		},	// VertexElementData::position
		{
			1u,
			0u,
			VK_FORMAT_R32G32B32A32_SFLOAT,
			static_cast<deUint32>(sizeof(tcu::Vec4))
		},	// VertexElementData::color
	};

	const VkPipelineVertexInputStateCreateInfo vf_info			=
	{																	// sType;
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,		// pNext;
		NULL,															// flags;
		0u,																// vertexBindingDescriptionCount;
		1,																// pVertexBindingDescriptions;
		&vertexInputBindingDescription,									// vertexAttributeDescriptionCount;
		2,																// pVertexAttributeDescriptions;
		vertexInputAttributeDescriptions
	};

	PipelineCreateInfo pipelineCreateInfo(*m_pipelineLayout, *m_renderPass, 0, (VkPipelineCreateFlags)0);
	pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*vs, "main", VK_SHADER_STAGE_VERTEX_BIT));
	pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*gs, "main", VK_SHADER_STAGE_GEOMETRY_BIT));
	pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*fs, "main", VK_SHADER_STAGE_FRAGMENT_BIT));
	pipelineCreateInfo.addState(PipelineCreateInfo::InputAssemblerState(m_parametersGraphic.primitiveTopology));
	pipelineCreateInfo.addState(PipelineCreateInfo::ColorBlendState(1, &attachmentState));

	const VkViewport	viewport	=
	{
		0.0f,		// float x;
		0.0f,		// float y;
		WIDTH,	// float width;
		HEIGHT,	// float height;
		0.0f,	// float minDepth;
		1.0f	// float maxDepth;
	};

	const VkRect2D		scissor		=
	{
		{
			0,		// deInt32 x
			0,		// deInt32 y
		},		// VkOffset2D	offset;
		{
			WIDTH,	// deInt32 width;
			HEIGHT,	// deInt32 height
		},		// VkExtent2D	extent;
	};
	pipelineCreateInfo.addState(PipelineCreateInfo::ViewportState(1, std::vector<VkViewport>(1, viewport), std::vector<VkRect2D>(1, scissor)));

	if (m_context.getDeviceFeatures().depthBounds)
		pipelineCreateInfo.addState(PipelineCreateInfo::DepthStencilState(true, true, VK_COMPARE_OP_GREATER_OR_EQUAL, true));
	else
		pipelineCreateInfo.addState(PipelineCreateInfo::DepthStencilState());

	pipelineCreateInfo.addState(PipelineCreateInfo::RasterizerState(false));
	pipelineCreateInfo.addState(PipelineCreateInfo::MultiSampleState());
	pipelineCreateInfo.addState(vf_info);
	m_pipeline = createGraphicsPipeline(vk, device, DE_NULL, &pipelineCreateInfo);
}